

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O1

int run_test_getsockname_udp(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uv_loop_t *loop;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  uv_tcp_t *tcp;
  void *pvVar6;
  uint uVar7;
  char *in_RCX;
  uint port;
  undefined8 *extraout_RDX;
  undefined8 unaff_RBX;
  uv_tcp_t *puVar8;
  uv_buf_t *puVar9;
  char *ip;
  undefined8 *__size;
  uv_stream_t *server;
  ulong *puVar10;
  uv_loop_t *unaff_R14;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr sockname;
  sockaddr_in addr;
  int namelen;
  ulong auStack_e8 [4];
  sockaddr_in sStack_c8;
  undefined8 uStack_b8;
  sockaddr_in sStack_b0;
  uv_tcp_t *puStack_a0;
  ulong uStack_90;
  sockaddr sStack_88;
  char acStack_78 [8];
  sockaddr sStack_70;
  int iStack_5c;
  undefined8 uStack_58;
  uv_loop_t *puStack_50;
  undefined8 local_48;
  long local_40;
  uv_buf_t local_38;
  char *local_28;
  int local_14;
  
  puStack_50 = (uv_loop_t *)0x19a550;
  ::loop = uv_default_loop();
  puStack_50 = (uv_loop_t *)0x19a56d;
  iVar4 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&stack0xffffffffffffffd8);
  local_40 = (long)iVar4;
  local_48 = 0;
  if (local_40 == 0) {
    puStack_50 = (uv_loop_t *)0x19a59e;
    iVar4 = uv_udp_init(::loop,&udpServer);
    if (iVar4 != 0) {
      puStack_50 = (uv_loop_t *)0x19a7da;
      run_test_getsockname_udp_cold_2();
      return 1;
    }
    puStack_50 = (uv_loop_t *)0x19a5b9;
    iVar4 = uv_udp_bind(&udpServer,(sockaddr *)&stack0xffffffffffffffd8,0);
    if (iVar4 != 0) {
      puStack_50 = (uv_loop_t *)0x19a7e1;
      run_test_getsockname_udp_cold_3();
      return 1;
    }
    local_38.len._0_4_ = 0xffffffff;
    local_38.base = (char *)0xffffffffffffffff;
    local_38.len._4_4_ = 0xffffffff;
    local_14 = 0x10;
    puStack_50 = (uv_loop_t *)0x19a5e5;
    iVar4 = uv_udp_getsockname(&udpServer,(sockaddr *)&local_38,&stack0xffffffffffffffec);
    local_40 = (long)iVar4;
    local_48 = 0;
    if (local_40 != 0) goto LAB_0019a7f5;
    in_RCX = "udp listener socket";
    puStack_50 = (uv_loop_t *)0x19a620;
    check_sockname((sockaddr *)&local_38,"0.0.0.0",0x23a3,"udp listener socket");
    getsocknamecount_udp = getsocknamecount_udp + 1;
    puStack_50 = (uv_loop_t *)0x19a640;
    iVar4 = uv_udp_recv_start(&udpServer,alloc,udp_recv);
    local_40 = (long)iVar4;
    local_48 = 0;
    if (local_40 != 0) goto LAB_0019a802;
    puStack_50 = (uv_loop_t *)0x19a671;
    iVar4 = uv_udp_init(::loop,&udp);
    if (iVar4 != 0) goto LAB_0019a80f;
    puStack_50 = (uv_loop_t *)0x19a68a;
    local_38 = uv_buf_init("PING",4);
    puStack_50 = (uv_loop_t *)0x19a6aa;
    iVar4 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)&stack0xffffffffffffffd8);
    local_40 = (long)iVar4;
    local_48 = 0;
    if (local_40 != 0) goto LAB_0019a814;
    in_RCX = (char *)0x1;
    puStack_50 = (uv_loop_t *)0x19a6f1;
    iVar4 = uv_udp_send(&send_req,&udp,&local_38,1,(sockaddr *)&stack0xffffffffffffffd8,udp_send);
    if (iVar4 != 0) goto LAB_0019a821;
    puStack_50 = (uv_loop_t *)0x19a707;
    uv_run(::loop,UV_RUN_DEFAULT);
    loop = ::loop;
    local_28 = (char *)0x2;
    sVar3 = local_38.len;
    local_38.base = (char *)(long)getsocknamecount_udp;
    if ((char *)(long)getsocknamecount_udp != (char *)0x2) goto LAB_0019a826;
    local_28 = (char *)udp.send_queue_size;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_38.len;
    local_38 = (uv_buf_t)(auVar1 << 0x40);
    if (udp.send_queue_size != 0) goto LAB_0019a835;
    local_28 = (char *)udpServer.send_queue_size;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar3;
    local_38 = (uv_buf_t)(auVar2 << 0x40);
    if (udpServer.send_queue_size != 0) goto LAB_0019a844;
    unaff_RBX = 0;
    puStack_50 = (uv_loop_t *)0x19a790;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    puStack_50 = (uv_loop_t *)0x19a79a;
    uv_run(loop,UV_RUN_DEFAULT);
    local_28 = (char *)0x0;
    puStack_50 = (uv_loop_t *)0x19a7af;
    iVar4 = uv_loop_close(::loop);
    local_38.base = (char *)(long)iVar4;
    unaff_R14 = loop;
    if (local_28 == (char *)(long)iVar4) {
      puStack_50 = (uv_loop_t *)0x19a7cb;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_50 = (uv_loop_t *)0x19a7f5;
    run_test_getsockname_udp_cold_1();
LAB_0019a7f5:
    puStack_50 = (uv_loop_t *)0x19a802;
    run_test_getsockname_udp_cold_4();
LAB_0019a802:
    puStack_50 = (uv_loop_t *)0x19a80f;
    run_test_getsockname_udp_cold_5();
LAB_0019a80f:
    puStack_50 = (uv_loop_t *)0x19a814;
    run_test_getsockname_udp_cold_6();
LAB_0019a814:
    puStack_50 = (uv_loop_t *)0x19a821;
    run_test_getsockname_udp_cold_7();
LAB_0019a821:
    puStack_50 = (uv_loop_t *)0x19a826;
    run_test_getsockname_udp_cold_8();
LAB_0019a826:
    puStack_50 = (uv_loop_t *)0x19a835;
    run_test_getsockname_udp_cold_9();
LAB_0019a835:
    puStack_50 = (uv_loop_t *)0x19a844;
    run_test_getsockname_udp_cold_10();
LAB_0019a844:
    puStack_50 = (uv_loop_t *)0x19a853;
    run_test_getsockname_udp_cold_11();
  }
  server = (uv_stream_t *)&stack0xffffffffffffffd8;
  puVar9 = &local_38;
  puStack_50 = (uv_loop_t *)on_connection;
  run_test_getsockname_udp_cold_12();
  puVar10 = &uStack_90;
  puVar8 = (uv_tcp_t *)((ulong)puVar9 & 0xffffffff);
  uStack_58 = unaff_RBX;
  puStack_50 = unaff_R14;
  if ((int)puVar9 != 0) {
    on_connection_cold_1();
  }
  sStack_70._0_8_ = SEXT48((int)puVar9);
  sStack_88.sa_family = 0;
  sStack_88.sa_data[0] = '\0';
  sStack_88.sa_data[1] = '\0';
  sStack_88.sa_data[2] = '\0';
  sStack_88.sa_data[3] = '\0';
  sStack_88.sa_data[4] = '\0';
  sStack_88.sa_data[5] = '\0';
  if (sStack_70._0_8_ == 0) {
    tcp = (uv_tcp_t *)malloc(0xd8);
    if (tcp == (uv_tcp_t *)0x0) goto LAB_0019aa10;
    iVar4 = uv_tcp_init(::loop,tcp);
    sStack_70._0_8_ = SEXT48(iVar4);
    sStack_88.sa_family = 0;
    sStack_88.sa_data[0] = '\0';
    sStack_88.sa_data[1] = '\0';
    sStack_88.sa_data[2] = '\0';
    sStack_88.sa_data[3] = '\0';
    sStack_88.sa_data[4] = '\0';
    sStack_88.sa_data[5] = '\0';
    puVar8 = tcp;
    if (sStack_70._0_8_ != 0) goto LAB_0019aa15;
    tcp->data = server;
    iVar4 = uv_accept(server,(uv_stream_t *)tcp);
    sStack_70._0_8_ = SEXT48(iVar4);
    sStack_88.sa_family = 0;
    sStack_88.sa_data[0] = '\0';
    sStack_88.sa_data[1] = '\0';
    sStack_88.sa_data[2] = '\0';
    sStack_88.sa_data[3] = '\0';
    sStack_88.sa_data[4] = '\0';
    sStack_88.sa_data[5] = '\0';
    if (sStack_70._0_8_ != 0) goto LAB_0019aa24;
    iStack_5c = 0x10;
    iVar4 = uv_tcp_getsockname(tcp,&sStack_70,&iStack_5c);
    sStack_88._0_8_ = SEXT48(iVar4);
    uStack_90 = 0;
    if (sStack_88._0_8_ != 0) goto LAB_0019aa33;
    in_RCX = "accepted socket";
    check_sockname(&sStack_70,"127.0.0.1",0x23a3,"accepted socket");
    getsocknamecount_tcp = getsocknamecount_tcp + 1;
    iStack_5c = 0x10;
    iVar4 = uv_tcp_getpeername(tcp,&sStack_88,&iStack_5c);
    uStack_90 = (ulong)iVar4;
    acStack_78[0] = '\0';
    acStack_78[1] = '\0';
    acStack_78[2] = '\0';
    acStack_78[3] = '\0';
    acStack_78[4] = '\0';
    acStack_78[5] = '\0';
    acStack_78[6] = '\0';
    acStack_78[7] = '\0';
    if (uStack_90 != 0) goto LAB_0019aa40;
    in_RCX = "accepted socket peer";
    check_sockname(&sStack_88,"127.0.0.1",connect_port,"accepted socket peer");
    getpeernamecount = getpeernamecount + 1;
    iVar4 = uv_read_start((uv_stream_t *)tcp,alloc,after_read);
    uStack_90 = (ulong)iVar4;
    acStack_78[0] = '\0';
    acStack_78[1] = '\0';
    acStack_78[2] = '\0';
    acStack_78[3] = '\0';
    acStack_78[4] = '\0';
    acStack_78[5] = '\0';
    acStack_78[6] = '\0';
    acStack_78[7] = '\0';
    if (uStack_90 == 0) {
      return iVar4;
    }
  }
  else {
    on_connection_cold_2();
LAB_0019aa10:
    on_connection_cold_8();
LAB_0019aa15:
    on_connection_cold_3();
LAB_0019aa24:
    on_connection_cold_4();
LAB_0019aa33:
    on_connection_cold_5();
LAB_0019aa40:
    on_connection_cold_6();
  }
  ip = acStack_78;
  on_connection_cold_7();
  sStack_c8._0_8_ = *puVar10;
  sStack_c8.sin_zero = *(uchar (*) [8])(puVar10 + 1);
  __size = (undefined8 *)(ulong)port;
  puStack_a0 = puVar8;
  iVar4 = uv_ip4_addr(ip,port,&sStack_b0);
  auStack_e8[0] = (ulong)iVar4;
  if (auStack_e8[0] == 0) {
    auStack_e8[0] = sStack_c8._0_8_ & 0xffff;
    if (auStack_e8[0] != 2) goto LAB_0019ab95;
    auStack_e8[0] = (ulong)sStack_b0.sin_family;
    if (auStack_e8[0] != 2) goto LAB_0019aba4;
    uVar5 = sStack_c8.sin_addr.s_addr >> 0x18 | (sStack_c8.sin_addr.s_addr & 0xff0000) >> 8 |
            (sStack_c8.sin_addr.s_addr & 0xff00) << 8 | sStack_c8.sin_addr.s_addr << 0x18;
    uVar7 = sStack_b0.sin_addr.s_addr >> 0x18 | (sStack_b0.sin_addr.s_addr & 0xff0000) >> 8 |
            (sStack_b0.sin_addr.s_addr & 0xff00) << 8 | sStack_b0.sin_addr.s_addr << 0x18;
    auStack_e8[0] = (ulong)(int)((uint)(uVar5 >= uVar7 && uVar5 != uVar7) - (uint)(uVar5 < uVar7));
    if (auStack_e8[0] != 0) goto LAB_0019abb3;
    if ((port != 0) && (sStack_c8.sin_port != sStack_b0.sin_port)) goto LAB_0019abd1;
    iVar4 = uv_ip4_name(&sStack_c8,(char *)auStack_e8,0x11);
    uStack_b8 = 0;
    if (iVar4 == 0) {
      iVar4 = printf("%s: %s:%d\n",in_RCX,auStack_e8,
                     (ulong)(ushort)(sStack_c8.sin_port << 8 | sStack_c8.sin_port >> 8));
      return iVar4;
    }
  }
  else {
    check_sockname_cold_1();
LAB_0019ab95:
    check_sockname_cold_2();
LAB_0019aba4:
    check_sockname_cold_3();
LAB_0019abb3:
    check_sockname_cold_4();
  }
  __size = &uStack_b8;
  check_sockname_cold_6();
LAB_0019abd1:
  check_sockname_cold_5();
  pvVar6 = malloc((size_t)__size);
  *extraout_RDX = pvVar6;
  extraout_RDX[1] = __size;
  return (int)pvVar6;
}

Assistant:

TEST_IMPL(getsockname_udp) {
  loop = uv_default_loop();

  if (udp_listener())
    return 1;

  udp_sender();

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(2, getsocknamecount_udp);

  ASSERT_OK(udp.send_queue_size);
  ASSERT_OK(udpServer.send_queue_size);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}